

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O1

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getMeasurement
          (DynamicalSystemSimulator *this,TimeIndex k)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long in_RDX;
  Index extraout_RDX;
  DenseStorage<double,__1,__1,_1,_0> *other;
  ulong uVar5;
  Vector VVar6;
  
  lVar2 = (*(long *)(k + 0x90) - *(long *)(k + 0x80) >> 4) +
          (*(long *)(k + 0xa0) - *(long *)(k + 0xa8) >> 4) +
          ((((ulong)(*(long *)(k + 0xb8) - *(long *)(k + 0x98)) >> 3) - 1) +
          (ulong)(*(long *)(k + 0xb8) == 0)) * 0x20;
  if ((lVar2 != 0) && (in_RDX <= *(long *)(k + 0x68))) {
    __assert_fail("(y_.size() == 0 || y_.getFirstIndex() < k) && \"ERROR: Only future measurements can be obtained\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/dynamical-system-simulator.cpp"
                  ,0x24,
                  "virtual Vector stateObservation::DynamicalSystemSimulator::getMeasurement(TimeIndex)"
                 );
  }
  if (lVar2 + *(long *)(k + 0x68) < in_RDX) {
    (**(code **)(*(long *)k + 0x40))(k);
  }
  lVar2 = *(long *)(k + 0x80);
  lVar3 = (*(long *)(k + 0x90) - lVar2 >> 4) +
          (*(long *)(k + 0xa0) - *(long *)(k + 0xa8) >> 4) +
          ((((ulong)(*(long *)(k + 0xb8) - *(long *)(k + 0x98)) >> 3) - 1) +
          (ulong)(*(long *)(k + 0xb8) == 0)) * 0x20;
  if (lVar3 != 0) {
    lVar1 = *(long *)(k + 0x68);
    if ((lVar1 <= in_RDX) && (in_RDX < lVar1 + lVar3)) {
      uVar4 = (lVar2 - *(long *)(k + 0x88) >> 4) + (in_RDX - lVar1);
      if (uVar4 < 0x20) {
        other = (DenseStorage<double,__1,__1,_1,_0> *)(lVar2 + (in_RDX - lVar1) * 0x10);
      }
      else {
        uVar5 = uVar4 >> 5 | 0xf800000000000000;
        if (0 < (long)uVar4) {
          uVar5 = uVar4 >> 5;
        }
        other = (DenseStorage<double,__1,__1,_1,_0> *)
                ((uVar4 + uVar5 * -0x20) * 0x10 + *(long *)(*(long *)(k + 0x98) + uVar5 * 8));
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)this,other);
      VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (Vector)VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x192,
                "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

Vector DynamicalSystemSimulator::getMeasurement(TimeIndex k)
{
  BOOST_ASSERT((y_.size() == 0 || y_.getFirstIndex() < k) && "ERROR: Only future measurements can be obtained");
  if(y_.getNextIndex() < k) simulateDynamicsTo(k);

  return y_[k];
}